

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

int Ssc_GiaSimHashKey(Gia_Man_t *p,int iObj,int nTableSize)

{
  int iVar1;
  word *pwVar2;
  uint local_28;
  int nWords;
  int i;
  uint uHash;
  word *pSim;
  int nTableSize_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pwVar2 = Gia_ObjSim(p,iObj);
  nWords = 0;
  iVar1 = Gia_ObjSimWords(p);
  if ((*pwVar2 & 1) == 0) {
    for (local_28 = 0; (int)local_28 < iVar1; local_28 = local_28 + 1) {
      nWords = nWords ^ (int)pwVar2[(int)local_28] *
                        Ssc_GiaSimHashKey::s_Primes[(int)(local_28 & 0xf)];
    }
  }
  else {
    for (local_28 = 0; (int)local_28 < iVar1; local_28 = local_28 + 1) {
      nWords = nWords ^ ((uint)pwVar2[(int)local_28] ^ 0xffffffff) *
                        Ssc_GiaSimHashKey::s_Primes[(int)(local_28 & 0xf)];
    }
  }
  return (uint)nWords % (uint)nTableSize;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes hash key of the simuation info.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline int Ssc_GiaSimHashKey( Gia_Man_t * p, int iObj, int nTableSize )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    word * pSim = Gia_ObjSim( p, iObj );
    unsigned uHash = 0;
    int i, nWords = Gia_ObjSimWords(p);
    if ( pSim[0] & 1 )
        for ( i = 0; i < nWords; i++ )
            uHash ^= ~pSim[i] * s_Primes[i & 0xf];
    else
        for ( i = 0; i < nWords; i++ )
            uHash ^= pSim[i] * s_Primes[i & 0xf];
    return (int)(uHash % nTableSize);
}